

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O0

hand * __thiscall hand::printHidden_abi_cxx11_(hand *this)

{
  bool bVar1;
  long in_RSI;
  card *card;
  iterator __end1;
  iterator __begin1;
  vector<card,_std::allocator<card>_> *__range1;
  hand *this_local;
  string *output;
  
  std::__cxx11::string::string((string *)this);
  __end1 = std::vector<card,_std::allocator<card>_>::begin
                     ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  card = (card *)std::vector<card,_std::allocator<card>_>::end
                           ((vector<card,_std::allocator<card>_> *)(in_RSI + 8));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>
                                     *)&card), bVar1) {
    __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::operator*
              (&__end1);
    std::__cxx11::string::operator+=((string *)this,"[?] ");
    __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::operator++
              (&__end1);
  }
  return this;
}

Assistant:

string hand::printHidden() {
    string output;
    for (auto &card : hand_) output += "[?] ";
    return output;
}